

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O2

void __thiscall QEvdevTabletHandler::readData(QEvdevTabletHandler *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  input_event *ev;
  long in_FS_OFFSET;
  bool bVar10;
  char local_358 [24];
  char *local_340;
  input_event buffer [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(buffer,0xaa,0x300);
  uVar8 = 0;
LAB_001086f9:
  do {
    iVar2 = this->m_fd;
    do {
      sVar4 = read(iVar2,(void *)((long)&buffer[0].time.tv_sec + uVar8),0x300 - uVar8);
      if (sVar4 != -1) {
        iVar2 = (int)sVar4;
        if (iVar2 == 0) {
          local_358[0] = '\x02';
          local_358[1] = '\0';
          local_358[2] = '\0';
          local_358[3] = '\0';
          local_358[0x14] = '\0';
          local_358[0x15] = '\0';
          local_358[0x16] = '\0';
          local_358[0x17] = '\0';
          local_358[4] = '\0';
          local_358[5] = '\0';
          local_358[6] = '\0';
          local_358[7] = '\0';
          local_358[8] = '\0';
          local_358[9] = '\0';
          local_358[10] = '\0';
          local_358[0xb] = '\0';
          local_358[0xc] = '\0';
          local_358[0xd] = '\0';
          local_358[0xe] = '\0';
          local_358[0xf] = '\0';
          local_358[0x10] = '\0';
          local_358[0x11] = '\0';
          local_358[0x12] = '\0';
          local_358[0x13] = '\0';
          local_340 = "default";
          uVar6 = QString::utf16();
          QMessageLogger::warning(local_358,"evdevtablet: %ls: Got EOF from input device",uVar6);
          goto LAB_00108809;
        }
        if (-1 < iVar2) {
          uVar7 = (int)uVar8 + iVar2;
          uVar8 = (ulong)uVar7;
          uVar9 = uVar8 / 0x18;
          if (uVar7 % 0x18 == 0) {
            ev = buffer;
            while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
              QEvdevTabletData::processInputEvent(this->d,ev);
              ev = ev + 1;
            }
            goto LAB_00108809;
          }
          goto LAB_001086f9;
        }
        piVar5 = __errno_location();
        iVar3 = *piVar5;
        break;
      }
      piVar5 = __errno_location();
      iVar3 = *piVar5;
    } while (iVar3 == 4);
    if ((iVar3 != 4) && (iVar3 != 0xb)) {
      uVar6 = QString::utf16();
      qErrnoWarning("evdevtablet: %ls: Could not read from input device",uVar6);
      if (*piVar5 == 0x13) {
        if (this->m_notifier != (QSocketNotifier *)0x0) {
          (**(code **)(*(long *)this->m_notifier + 0x20))();
        }
        this->m_notifier = (QSocketNotifier *)0x0;
        qt_safe_close(this->m_fd);
        this->m_fd = -1;
      }
LAB_00108809:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void QEvdevTabletHandler::readData()
{
    input_event buffer[32];
    int n = 0;
    for (; ;) {
        int result = QT_READ(m_fd, reinterpret_cast<char*>(buffer) + n, sizeof(buffer) - n);
        if (!result) {
            qWarning("evdevtablet: %ls: Got EOF from input device", qUtf16Printable(m_device));
            return;
        } else if (result < 0) {
            if (errno != EINTR && errno != EAGAIN) {
                qErrnoWarning("evdevtablet: %ls: Could not read from input device", qUtf16Printable(m_device));
                if (errno == ENODEV) { // device got disconnected -> stop reading
                    delete m_notifier;
                    m_notifier = 0;
                    QT_CLOSE(m_fd);
                    m_fd = -1;
                }
                return;
            }
        } else {
            n += result;
            if (n % sizeof(input_event) == 0)
                break;
        }
    }

    n /= sizeof(input_event);

    for (int i = 0; i < n; ++i)
        d->processInputEvent(&buffer[i]);
}